

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

void __thiscall
cmOrderDirectoriesConstraint::FindImplicitConflicts
          (cmOrderDirectoriesConstraint *this,ostringstream *w)

{
  pointer pbVar1;
  size_t __n;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  _Alloc_hider _Var6;
  pointer path;
  string local_70;
  string local_50;
  
  path = (this->OD->OriginalDirectories).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->OD->OriginalDirectories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (path != pbVar1) {
    bVar2 = true;
    do {
      __n = path->_M_string_length;
      if (__n == (this->Directory)._M_string_length) {
        if (__n != 0) {
          iVar4 = bcmp((path->_M_dataplus)._M_p,(this->Directory)._M_dataplus._M_p,__n);
          if (iVar4 != 0) goto LAB_0034104d;
        }
      }
      else {
LAB_0034104d:
        cmsys::SystemTools::GetRealPath(&local_50,path,(string *)0x0);
        cmsys::SystemTools::GetRealPath(&local_70,&this->Directory,(string *)0x0);
        _Var6._M_p = local_70._M_dataplus._M_p;
        if (local_50._M_string_length == local_70._M_string_length) {
          if (local_50._M_string_length != 0) {
            iVar4 = bcmp(local_50._M_dataplus._M_p,local_70._M_dataplus._M_p,
                         local_50._M_string_length);
            if (iVar4 != 0) goto LAB_00341094;
          }
          cVar3 = '\0';
        }
        else {
LAB_00341094:
          iVar4 = (*this->_vptr_cmOrderDirectoriesConstraint[3])(this,path);
          cVar3 = (char)iVar4;
          _Var6._M_p = local_70._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var6._M_p != &local_70.field_2) {
          operator_delete(_Var6._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (cVar3 != '\0') {
          if (bVar2) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)w,"  ",2);
            (*this->_vptr_cmOrderDirectoriesConstraint[2])(this,w);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)w," in ",4);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)w,(this->Directory)._M_dataplus._M_p,
                                (this->Directory)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5," may be hidden by files in:\n",0x1c);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)w,"    ",4);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)w,(path->_M_dataplus)._M_p,path->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          bVar2 = false;
        }
      }
      path = path + 1;
    } while (path != pbVar1);
  }
  return;
}

Assistant:

void FindImplicitConflicts(std::ostringstream& w)
  {
    bool first = true;
    for (std::string const& dir : this->OD->OriginalDirectories) {
      // Check if this directory conflicts with the entry.
      if (dir != this->Directory &&
          cmSystemTools::GetRealPath(dir) !=
            cmSystemTools::GetRealPath(this->Directory) &&
          this->FindConflict(dir)) {
        // The library will be found in this directory but it is
        // supposed to be found in an implicit search directory.
        if (first) {
          first = false;
          w << "  ";
          this->Report(w);
          w << " in " << this->Directory << " may be hidden by files in:\n";
        }
        w << "    " << dir << "\n";
      }
    }
  }